

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDSharedSimd128.cpp
# Opt level: O1

void __thiscall
LowererMD::CheckShuffleLanes_4
          (LowererMD *this,uint8 *lanes,uint8 *lanesSrc,uint *fromSrc1,uint *fromSrc2)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  uint i;
  long lVar4;
  
  if (lanes == (uint8 *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                       ,0xcae,"(lanes)","lanes");
    if (!bVar2) goto LAB_0067e223;
    *puVar3 = 0;
  }
  if (lanesSrc == (uint8 *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                       ,0xcaf,"(lanesSrc)","lanesSrc");
    if (!bVar2) goto LAB_0067e223;
    *puVar3 = 0;
  }
  if (fromSrc1 == (uint *)0x0 || fromSrc2 == (uint *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                       ,0xcb0,"(fromSrc1 && fromSrc2)","fromSrc1 && fromSrc2");
    if (!bVar2) {
LAB_0067e223:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  lVar4 = 0;
  *fromSrc1 = 0;
  *fromSrc2 = 0;
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  do {
    if (lanes[lVar4] < 4) {
      *fromSrc1 = *fromSrc1 + 1;
      lanesSrc[lVar4] = '\x01';
    }
    else if (lanes[lVar4] < 8) {
      *fromSrc2 = *fromSrc2 + 1;
      lanesSrc[lVar4] = '\x02';
    }
    else {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                         ,0xcc1,"((0))","UNREACHED");
      if (!bVar2) goto LAB_0067e223;
      *puVar3 = 0;
    }
    lVar4 = lVar4 + 1;
    if (lVar4 == 4) {
      return;
    }
  } while( true );
}

Assistant:

void LowererMD::CheckShuffleLanes_4(uint8 lanes[], uint8 lanesSrc[], uint *fromSrc1, uint *fromSrc2)
{
    Assert(lanes);
    Assert(lanesSrc);
    Assert(fromSrc1 && fromSrc2);
    *fromSrc1 = 0;
    *fromSrc2 = 0;
    for (uint i = 0; i < 4; i++)
    {
        if (lanes[i] >= 0 && lanes[i] < 4)
        {
            (*fromSrc1)++;
            lanesSrc[i] = 1;
        }
        else if (lanes[i] >= 4 && lanes[i] < 8)
        {
            (*fromSrc2)++;
            lanesSrc[i] = 2;
        }
        else
        {
            Assert(UNREACHED);
        }
    }
}